

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_InitUndeclLocalConstProperty<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout)

{
  Var obj;
  PropertyId propertyId_00;
  JavascriptLibrary *this_00;
  Var newValue;
  PropertyId propertyId;
  OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  propertyId_00 = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  obj = *(Var *)(this + 0x58);
  this_00 = ScriptContext::GetLibrary(*(ScriptContext **)(this + 0x78));
  newValue = JavascriptLibrary::GetUndeclBlockVar(this_00);
  Js::JavascriptOperators::OP_InitConstProperty(obj,propertyId_00,newValue);
  return;
}

Assistant:

void InterpreterStackFrame::OP_InitUndeclLocalConstProperty(unaligned T* playout)
    {
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        JavascriptOperators::OP_InitConstProperty(this->localClosure, propertyId, this->scriptContext->GetLibrary()->GetUndeclBlockVar());
    }